

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall Rml::Context::UnfocusDocument(Context *this,ElementDocument *document)

{
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  __position;
  Element *this_00;
  Element **ppEVar1;
  
  __position = ::std::
               __find_if<__gnu_cxx::__normal_iterator<Rml::Element**,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>,__gnu_cxx::__ops::_Iter_equals_val<Rml::ElementDocument*const>>
                         ((this->document_focus_history).
                          super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  ppEVar1 = (this->document_focus_history).
            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (__position._M_current != ppEVar1) {
    ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::erase
              (&this->document_focus_history,(const_iterator)__position._M_current);
    ppEVar1 = (this->document_focus_history).
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if ((this->document_focus_history).
      super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppEVar1) {
    this_00 = Element::GetFocusLeafNode(ppEVar1[-1]);
    Element::Focus(this_00,false);
  }
  return;
}

Assistant:

void Context::UnfocusDocument(ElementDocument* document)
{
	auto it = std::find(document_focus_history.begin(), document_focus_history.end(), document);
	if (it != document_focus_history.end())
		document_focus_history.erase(it);

	if (!document_focus_history.empty())
		document_focus_history.back()->GetFocusLeafNode()->Focus();
}